

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxgeometsc.hpp
# Opt level: O2

void __thiscall
soplex::
SPxGeometSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::scale(SPxGeometSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *lp,bool persistent)

{
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar1;
  type_conflict5 tVar2;
  type_conflict5 tVar3;
  uint uVar4;
  SPxOut *pSVar5;
  int *piVar6;
  bool *pbVar7;
  char *pcVar8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_R9;
  int t;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar9;
  DataArray<int> *vecExp;
  DataArray<int> *vecExp_00;
  bool bVar10;
  Real val;
  Verbosity old_verbosity_1;
  uint uStack_794;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_790;
  uint local_788 [2];
  uint auStack_780 [2];
  uint local_778 [2];
  int local_770;
  bool local_76c [4];
  DLPSV *local_768;
  undefined1 local_758 [16];
  uint local_748;
  uint uStack_744;
  uint uStack_740;
  uint uStack_73c;
  undefined8 local_738;
  int local_730;
  bool local_72c [4];
  DLPSV *local_728;
  Verbosity old_verbosity_2;
  undefined1 auStack_714 [12];
  Item *pIStack_710;
  uint local_708;
  uint uStack_704;
  uint uStack_700;
  uint uStack_6fc;
  uint local_6f8;
  undefined3 uStack_6f3;
  int local_6f0;
  bool local_6ec;
  DLPSV *local_6e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  epsilon;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  rowscale;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  colscale;
  double local_668;
  Item *pIStack_660;
  DLPSV *local_658;
  int iStack_650;
  int iStack_64c;
  int local_648;
  int iStack_644;
  int local_640;
  bool local_63c;
  DLPSV *local_638;
  Verbosity old_verbosity_5;
  uint uStack_624;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_620;
  uint local_618 [2];
  uint auStack_610 [2];
  uint local_608 [2];
  int local_600;
  bool local_5fc;
  DLPSV *local_5f8;
  Verbosity *local_5e8;
  Verbosity *local_5e0;
  double local_5d8;
  Item *pIStack_5d0;
  DLPSV *local_5c8;
  int iStack_5c0;
  int iStack_5bc;
  int local_5b8;
  int iStack_5b4;
  int local_5b0;
  bool local_5ac;
  DLPSV *local_5a8;
  undefined1 local_598 [16];
  undefined1 local_588 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_580;
  uint local_578 [2];
  uint auStack_570 [2];
  uint local_568 [2];
  int local_560;
  bool local_55c;
  DLPSV *local_558;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  rowratio;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  colratio;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_498;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_458;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  local_418;
  uint auStack_400 [2];
  uint local_3f8 [2];
  int local_3f0;
  undefined1 local_3ec;
  fpclass_type local_3e8;
  int32_t iStack_3e4;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  local_3d8;
  uint auStack_3c0 [2];
  uint local_3b8 [2];
  int local_3b0;
  undefined1 local_3ac;
  fpclass_type local_3a8;
  int32_t iStack_3a4;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  local_398;
  uint auStack_380 [2];
  uint local_378 [2];
  int local_370;
  undefined1 local_36c;
  fpclass_type local_368;
  int32_t iStack_364;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  local_358;
  uint auStack_340 [2];
  uint local_338 [2];
  int local_330;
  undefined1 local_32c;
  fpclass_type local_328;
  int32_t iStack_324;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_318;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2e0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_270;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_238;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_200;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_190;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_158;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_118;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  pSVar5 = (this->
           super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).spxout;
  if ((pSVar5 != (SPxOut *)0x0) && (2 < (int)pSVar5->m_verbosity)) {
    rowratio.m_backend.data._M_elems[0] = 3;
    colratio.m_backend.data._M_elems[0] = pSVar5->m_verbosity;
    (*pSVar5->_vptr_SPxOut[2])();
    pSVar5 = soplex::operator<<((this->
                                super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).spxout,"Geometric scaling LP");
    pcVar8 = " (persistent)";
    if (!persistent) {
      pcVar8 = "";
    }
    pSVar5 = soplex::operator<<(pSVar5,pcVar8);
    pcVar8 = " with post-equilibration";
    if (this->postequilibration == false) {
      pcVar8 = "";
    }
    pSVar5 = soplex::operator<<(pSVar5,pcVar8);
    std::endl<char,std::char_traits<char>>(pSVar5->m_streams[pSVar5->m_verbosity]);
    pSVar5 = (this->
             super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).spxout;
    (*pSVar5->_vptr_SPxOut[2])(pSVar5,&colratio);
  }
  (**(this->
     super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
     )._vptr_SPxScaler)(this,lp);
  (*(this->
    super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    )._vptr_SPxScaler[0x33])(&colratio,this,lp);
  (*(this->
    super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    )._vptr_SPxScaler[0x34])(&rowratio,this,lp);
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)local_588,
             &(this->
              super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
  val = Tolerances::epsilon((Tolerances *)local_588);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (&epsilon.m_backend,val,(type *)0x0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_580);
  tVar2 = boost::multiprecision::operator<(&colratio,&rowratio);
  pnVar9 = &colratio;
  pnVar1 = &rowratio;
  if (tVar2) {
    pnVar9 = &rowratio;
    pnVar1 = &colratio;
  }
  local_588 = *(undefined1 (*) [8])(pnVar1->m_backend).data._M_elems;
  _Stack_580._M_pi =
       *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((pnVar1->m_backend).data._M_elems + 2);
  local_578 = *(uint (*) [2])((pnVar1->m_backend).data._M_elems + 4);
  auStack_570 = *(uint (*) [2])((pnVar1->m_backend).data._M_elems + 6);
  local_568 = *(uint (*) [2])((pnVar1->m_backend).data._M_elems + 8);
  local_560 = (pnVar1->m_backend).exp;
  local_55c = (pnVar1->m_backend).neg;
  local_648 = (pnVar9->m_backend).data._M_elems[8];
  iStack_644 = (pnVar9->m_backend).data._M_elems[9];
  local_668 = *(double *)(pnVar9->m_backend).data._M_elems;
  pIStack_660 = *(Item **)((pnVar9->m_backend).data._M_elems + 2);
  local_658 = *(DLPSV **)((pnVar9->m_backend).data._M_elems + 4);
  iStack_650 = (pnVar9->m_backend).data._M_elems[6];
  iStack_64c = (pnVar9->m_backend).data._M_elems[7];
  local_640 = (pnVar9->m_backend).exp;
  local_63c = (pnVar9->m_backend).neg;
  local_558 = *(DLPSV **)&(pnVar1->m_backend).fpclass;
  local_638 = *(DLPSV **)&(pnVar9->m_backend).fpclass;
  pSVar5 = (this->
           super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).spxout;
  if ((pSVar5 != (SPxOut *)0x0) && (3 < (int)pSVar5->m_verbosity)) {
    _old_verbosity_1 = (element_type *)CONCAT44(uStack_794,pSVar5->m_verbosity);
    local_758._0_4_ = 4;
    (*pSVar5->_vptr_SPxOut[2])();
    pSVar5 = soplex::operator<<((this->
                                super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).spxout,"before scaling:");
    pSVar5 = soplex::operator<<(pSVar5," min= ");
    (*(lp->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[3])(&local_68,lp,1);
    pSVar5 = soplex::operator<<(pSVar5,&local_68);
    pSVar5 = soplex::operator<<(pSVar5," max= ");
    (*(lp->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[4])(&local_a0,lp,1);
    pSVar5 = soplex::operator<<(pSVar5,&local_a0);
    pSVar5 = soplex::operator<<(pSVar5," col-ratio= ");
    local_d8.m_backend.data._M_elems[1] = colratio.m_backend.data._M_elems[1];
    local_d8.m_backend.data._M_elems[0] = colratio.m_backend.data._M_elems[0];
    local_d8.m_backend.data._M_elems[2] = colratio.m_backend.data._M_elems[2];
    local_d8.m_backend.data._M_elems[3] = colratio.m_backend.data._M_elems[3];
    local_d8.m_backend.data._M_elems[4] = colratio.m_backend.data._M_elems[4];
    local_d8.m_backend.data._M_elems[5] = colratio.m_backend.data._M_elems[5];
    local_d8.m_backend.data._M_elems[6] = colratio.m_backend.data._M_elems[6];
    local_d8.m_backend.data._M_elems[7] = colratio.m_backend.data._M_elems[7];
    local_d8.m_backend.data._M_elems[8] = colratio.m_backend.data._M_elems[8];
    local_d8.m_backend.data._M_elems[9] = colratio.m_backend.data._M_elems[9];
    local_d8.m_backend.exp = colratio.m_backend.exp;
    local_d8.m_backend.neg = colratio.m_backend.neg;
    local_d8.m_backend.fpclass = colratio.m_backend.fpclass;
    local_d8.m_backend.prec_elem = colratio.m_backend.prec_elem;
    pSVar5 = soplex::operator<<(pSVar5,&local_d8);
    pSVar5 = soplex::operator<<(pSVar5," row-ratio= ");
    local_118.m_backend.data._M_elems[1] = rowratio.m_backend.data._M_elems[1];
    local_118.m_backend.data._M_elems[0] = rowratio.m_backend.data._M_elems[0];
    local_118.m_backend.data._M_elems[2] = rowratio.m_backend.data._M_elems[2];
    local_118.m_backend.data._M_elems[3] = rowratio.m_backend.data._M_elems[3];
    local_118.m_backend.data._M_elems[4] = rowratio.m_backend.data._M_elems[4];
    local_118.m_backend.data._M_elems[5] = rowratio.m_backend.data._M_elems[5];
    local_118.m_backend.data._M_elems[6] = rowratio.m_backend.data._M_elems[6];
    local_118.m_backend.data._M_elems[7] = rowratio.m_backend.data._M_elems[7];
    local_118.m_backend.data._M_elems[8] = rowratio.m_backend.data._M_elems[8];
    local_118.m_backend.data._M_elems[9] = rowratio.m_backend.data._M_elems[9];
    local_118.m_backend.exp = rowratio.m_backend.exp;
    local_118.m_backend.neg = rowratio.m_backend.neg;
    local_118.m_backend.fpclass = rowratio.m_backend.fpclass;
    local_118.m_backend.prec_elem = rowratio.m_backend.prec_elem;
    pSVar5 = soplex::operator<<(pSVar5,&local_118);
    std::endl<char,std::char_traits<char>>(pSVar5->m_streams[pSVar5->m_verbosity]);
    pSVar5 = (this->
             super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).spxout;
    (*pSVar5->_vptr_SPxOut[2])(pSVar5,&old_verbosity_1);
  }
  tVar3 = boost::multiprecision::operator>
                    ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_668,&this->m_goodEnoughRatio);
  if (!tVar3) {
    pSVar5 = (this->
             super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).spxout;
    if ((pSVar5 != (SPxOut *)0x0) && (3 < (int)pSVar5->m_verbosity)) {
      _old_verbosity_1 = (element_type *)CONCAT44(uStack_794,pSVar5->m_verbosity);
      local_758._0_4_ = 4;
      (*pSVar5->_vptr_SPxOut[2])();
      pSVar5 = soplex::operator<<((this->
                                  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ).spxout,"No geometric scaling done, ratio good enough");
      std::endl<char,std::char_traits<char>>(pSVar5->m_streams[pSVar5->m_verbosity]);
      (*((this->
         super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).spxout)->_vptr_SPxOut[2])();
    }
    if (this->postequilibration == false) {
      lp->_isScaled = true;
      return;
    }
    pSVar5 = (this->
             super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).spxout;
    if ((pSVar5 != (SPxOut *)0x0) && (3 < (int)pSVar5->m_verbosity)) {
      _old_verbosity_1 = (element_type *)CONCAT44(uStack_794,pSVar5->m_verbosity);
      local_758._0_4_ = 4;
      (*pSVar5->_vptr_SPxOut[2])();
      pSVar5 = soplex::operator<<((this->
                                  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ).spxout," ... but will still perform equilibrium scaling");
      std::endl<char,std::char_traits<char>>(pSVar5->m_streams[pSVar5->m_verbosity]);
      (*((this->
         super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).spxout)->_vptr_SPxOut[2])();
    }
  }
  uVar4 = (lp->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            ((cpp_dec_float<50U,_int,_void> *)&old_verbosity_1,1.0,(type *)0x0);
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::vector(&rowscale,(ulong)uVar4,(value_type *)&old_verbosity_1,(allocator_type *)local_758);
  uVar4 = (lp->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            ((cpp_dec_float<50U,_int,_void> *)&old_verbosity_1,1.0,(type *)0x0);
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::vector(&colscale,(ulong)uVar4,(value_type *)&old_verbosity_1,(allocator_type *)local_758);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            ((cpp_dec_float<50U,_int,_void> *)&old_verbosity_1,0.0,(type *)0x0);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            ((cpp_dec_float<50U,_int,_void> *)local_758,0.0,(type *)0x0);
  if (tVar3) {
    local_608[0] = local_568[0];
    local_608[1] = local_568[1];
    local_618[0] = local_578[0];
    local_618[1] = local_578[1];
    auStack_610[0] = auStack_570[0];
    auStack_610[1] = auStack_570[1];
    _old_verbosity_5 = (element_type *)local_588;
    p_Stack_620 = _Stack_580._M_pi;
    local_600 = local_560;
    local_5fc = local_55c;
    local_5f8 = local_558;
    local_5b8 = local_648;
    iStack_5b4 = iStack_644;
    local_5c8 = local_658;
    iStack_5c0 = iStack_650;
    iStack_5bc = iStack_64c;
    local_5d8 = local_668;
    pIStack_5d0 = pIStack_660;
    local_5b0 = local_640;
    local_5ac = local_63c;
    local_5e0 = (Verbosity *)local_758;
    if (tVar2) {
      local_5e0 = &old_verbosity_1;
    }
    local_5a8 = local_638;
    local_5e8 = &old_verbosity_1;
    if (tVar2) {
      local_5e8 = (Verbosity *)local_758;
    }
    pnVar1 = &this->m_minImprovement;
    uVar4 = (uint)tVar2;
    local_598._0_4_ = (int)(uVar4 << 0x1f) >> 0x1f;
    local_598._4_4_ = (int)(uVar4 << 0x1f) >> 0x1f;
    local_598._8_4_ = (int)(uVar4 << 0x1f) >> 0x1f;
    local_598._12_4_ = 0;
    for (t = 0; t < this->m_maxIterations; t = t + 1) {
      if (tVar2) {
        local_358.
        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)epsilon.m_backend.data._M_elems._0_8_;
        local_358.
        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)epsilon.m_backend.data._M_elems._8_8_;
        local_358.
        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)epsilon.m_backend.data._M_elems._16_8_;
        auStack_340[0] = epsilon.m_backend.data._M_elems[6];
        auStack_340[1] = epsilon.m_backend.data._M_elems[7];
        local_338[0] = epsilon.m_backend.data._M_elems[8];
        local_338[1] = epsilon.m_backend.data._M_elems[9];
        local_330 = epsilon.m_backend.exp;
        local_32c = epsilon.m_backend.neg;
        local_328 = epsilon.m_backend.fpclass;
        iStack_324 = epsilon.m_backend.prec_elem;
        computeScalingVec<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&old_verbosity_2,
                   (soplex *)
                   &lp->
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ,(SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)&rowscale,&colscale,&local_358,in_R9);
        local_778[1]._1_3_ = uStack_6f3;
        local_778._0_5_ = _local_6f8;
        local_788[1] = uStack_704;
        local_788[0] = local_708;
        auStack_780[1] = uStack_6fc;
        auStack_780[0] = uStack_700;
        _old_verbosity_1 = _old_verbosity_2;
        p_Stack_790 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pIStack_710;
        local_770 = local_6f0;
        local_76c[0] = local_6ec;
        local_768 = local_6e8;
        local_398.
        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)epsilon.m_backend.data._M_elems._0_8_;
        local_398.
        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)epsilon.m_backend.data._M_elems._8_8_;
        local_398.
        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)epsilon.m_backend.data._M_elems._16_8_;
        auStack_380[0] = epsilon.m_backend.data._M_elems[6];
        auStack_380[1] = epsilon.m_backend.data._M_elems[7];
        local_378[0] = epsilon.m_backend.data._M_elems[8];
        local_378[1] = epsilon.m_backend.data._M_elems[9];
        local_370 = epsilon.m_backend.exp;
        local_36c = epsilon.m_backend.neg;
        local_368 = epsilon.m_backend.fpclass;
        iStack_364 = epsilon.m_backend.prec_elem;
        computeScalingVec<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&old_verbosity_2,(soplex *)lp,
                   (SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)&colscale,&rowscale,&local_398,in_R9);
        local_738._5_3_ = uStack_6f3;
        local_738._0_5_ = _local_6f8;
        local_758._0_8_ = _old_verbosity_2;
        local_758._8_8_ = pIStack_710;
      }
      else {
        local_3d8.
        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)epsilon.m_backend.data._M_elems._0_8_;
        local_3d8.
        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)epsilon.m_backend.data._M_elems._8_8_;
        local_3d8.
        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)epsilon.m_backend.data._M_elems._16_8_;
        auStack_3c0[0] = epsilon.m_backend.data._M_elems[6];
        auStack_3c0[1] = epsilon.m_backend.data._M_elems[7];
        local_3b8[0] = epsilon.m_backend.data._M_elems[8];
        local_3b8[1] = epsilon.m_backend.data._M_elems[9];
        local_3b0 = epsilon.m_backend.exp;
        local_3ac = epsilon.m_backend.neg;
        local_3a8 = epsilon.m_backend.fpclass;
        iStack_3a4 = epsilon.m_backend.prec_elem;
        computeScalingVec<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&old_verbosity_2,(soplex *)lp,
                   (SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)&colscale,&rowscale,&local_3d8,in_R9);
        local_778[1]._1_3_ = uStack_6f3;
        local_778._0_5_ = _local_6f8;
        local_788[1] = uStack_704;
        local_788[0] = local_708;
        auStack_780[1] = uStack_6fc;
        auStack_780[0] = uStack_700;
        _old_verbosity_1 = _old_verbosity_2;
        p_Stack_790 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pIStack_710;
        local_770 = local_6f0;
        local_76c[0] = local_6ec;
        local_768 = local_6e8;
        local_418.
        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)epsilon.m_backend.data._M_elems._0_8_;
        local_418.
        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)epsilon.m_backend.data._M_elems._8_8_;
        local_418.
        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)epsilon.m_backend.data._M_elems._16_8_;
        auStack_400[0] = epsilon.m_backend.data._M_elems[6];
        auStack_400[1] = epsilon.m_backend.data._M_elems[7];
        local_3f8[0] = epsilon.m_backend.data._M_elems[8];
        local_3f8[1] = epsilon.m_backend.data._M_elems[9];
        local_3f0 = epsilon.m_backend.exp;
        local_3ec = epsilon.m_backend.neg;
        local_3e8 = epsilon.m_backend.fpclass;
        iStack_3e4 = epsilon.m_backend.prec_elem;
        computeScalingVec<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&old_verbosity_2,
                   (soplex *)
                   &lp->
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ,(SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)&rowscale,&colscale,&local_418,in_R9);
        local_738._5_3_ = uStack_6f3;
        local_738._0_5_ = _local_6f8;
        local_758._0_8_ = _old_verbosity_2;
        local_758._8_8_ = pIStack_710;
      }
      pSVar5 = (this->
               super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).spxout;
      local_748 = local_708;
      uStack_744 = uStack_704;
      uStack_740 = uStack_700;
      uStack_73c = uStack_6fc;
      local_730 = local_6f0;
      local_72c[0] = local_6ec;
      local_728 = local_6e8;
      if ((pSVar5 != (SPxOut *)0x0) && (4 < (int)pSVar5->m_verbosity)) {
        old_verbosity_2 = pSVar5->m_verbosity;
        result_1.m_backend.data._M_elems[0] = 5;
        (*pSVar5->_vptr_SPxOut[2])(pSVar5,&result_1.m_backend);
        pSVar5 = soplex::operator<<((this->
                                    super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ).spxout,"Geometric scaling round ");
        pSVar5 = soplex::operator<<(pSVar5,t);
        pSVar5 = soplex::operator<<(pSVar5," col-ratio= ");
        local_458.m_backend.data._M_elems._32_8_ = *(undefined8 *)(local_5e0 + 8);
        local_458.m_backend.data._M_elems._0_8_ = *(undefined8 *)local_5e0;
        local_458.m_backend.data._M_elems._8_8_ = *(undefined8 *)(local_5e0 + 2);
        local_458.m_backend.data._M_elems._16_8_ = *(undefined8 *)(local_5e0 + 4);
        local_458.m_backend.data._M_elems._24_8_ = *(undefined8 *)(local_5e0 + 6);
        piVar6 = &local_730;
        if (tVar2) {
          piVar6 = &local_770;
        }
        local_458.m_backend.exp = *piVar6;
        pbVar7 = local_72c;
        if (tVar2) {
          pbVar7 = local_76c;
        }
        local_458.m_backend.neg = *pbVar7;
        local_458.m_backend._48_8_ =
             CONCAT44((uint)((ulong)local_768 >> 0x20) & local_598._4_4_,
                      (fpclass_type)local_768 & local_598._0_4_) |
             CONCAT44(~local_598._4_4_ & (uint)((ulong)local_728 >> 0x20),
                      ~local_598._0_4_ & (fpclass_type)local_728);
        pSVar5 = soplex::operator<<(pSVar5,&local_458);
        pSVar5 = soplex::operator<<(pSVar5," row-ratio= ");
        local_498.m_backend.data._M_elems._32_8_ = *(undefined8 *)(local_5e8 + 8);
        local_498.m_backend.data._M_elems._0_8_ = *(undefined8 *)local_5e8;
        local_498.m_backend.data._M_elems._8_8_ = *(undefined8 *)(local_5e8 + 2);
        local_498.m_backend.data._M_elems._16_8_ = *(undefined8 *)(local_5e8 + 4);
        local_498.m_backend.data._M_elems._24_8_ = *(undefined8 *)(local_5e8 + 6);
        piVar6 = &local_770;
        if (tVar2) {
          piVar6 = &local_730;
        }
        local_498.m_backend.exp = *piVar6;
        pbVar7 = local_76c;
        if (tVar2) {
          pbVar7 = local_72c;
        }
        local_498.m_backend.neg = *pbVar7;
        local_498.m_backend._48_8_ =
             CONCAT44((uint)((ulong)local_728 >> 0x20) & local_598._4_4_,
                      (fpclass_type)local_728 & local_598._0_4_) |
             CONCAT44(~local_598._4_4_ & (uint)((ulong)local_768 >> 0x20),
                      ~local_598._0_4_ & (fpclass_type)local_768);
        pSVar5 = soplex::operator<<(pSVar5,&local_498);
        std::endl<char,std::char_traits<char>>(pSVar5->m_streams[pSVar5->m_verbosity]);
        pSVar5 = (this->
                 super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).spxout;
        (*pSVar5->_vptr_SPxOut[2])(pSVar5,(cpp_dec_float<50U,_int,_void> *)&old_verbosity_2);
      }
      local_6e8 = (DLPSV *)0xa00000000;
      _old_verbosity_2 = ZEXT816(0);
      local_708 = 0;
      uStack_704 = 0;
      uStack_700 = 0;
      uStack_6fc = 0;
      _local_6f8 = 0;
      uStack_6f3 = 0;
      local_6f0 = 0;
      local_6ec = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                ((cpp_dec_float<50U,_int,_void> *)&old_verbosity_2,&pnVar1->m_backend,
                 (cpp_dec_float<50U,_int,_void> *)&old_verbosity_5);
      tVar3 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&old_verbosity_1,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&old_verbosity_2);
      if (tVar3) {
        result_1.m_backend.fpclass = cpp_dec_float_finite;
        result_1.m_backend.prec_elem = 10;
        result_1.m_backend.data._M_elems._0_16_ = ZEXT816(0);
        result_1.m_backend.data._M_elems[4] = 0;
        result_1.m_backend.data._M_elems[5] = 0;
        result_1.m_backend.data._M_elems._24_5_ = 0;
        result_1.m_backend.data._M_elems[7]._1_3_ = 0;
        result_1.m_backend.data._M_elems._32_5_ = 0;
        result_1.m_backend._37_8_ = 0;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&result_1.m_backend,&pnVar1->m_backend,
                   (cpp_dec_float<50U,_int,_void> *)&local_5d8);
        tVar3 = boost::multiprecision::operator>
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)local_758,
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&result_1.m_backend);
        if (tVar3) break;
      }
      local_608[0] = local_778[0];
      local_608[1] = local_778[1];
      _old_verbosity_5 = _old_verbosity_1;
      p_Stack_620 = p_Stack_790;
      local_618[0] = local_788[0];
      local_618[1] = local_788[1];
      auStack_610[0] = auStack_780[0];
      auStack_610[1] = auStack_780[1];
      local_600 = local_770;
      local_5fc = local_76c[0];
      local_5f8 = local_768;
      local_5d8 = (double)local_758._0_8_;
      pIStack_5d0 = (Item *)local_758._8_8_;
      local_5c8 = (DLPSV *)CONCAT44(uStack_744,local_748);
      iStack_5bc = uStack_73c;
      iStack_5c0 = uStack_740;
      local_5b8 = (int)local_738;
      iStack_5b4 = local_738._4_4_;
      local_5b0 = local_730;
      local_5ac = local_72c[0];
      local_5a8 = local_728;
    }
    local_6e8 = (DLPSV *)0xa00000000;
    _old_verbosity_2 = (undefined1  [16])0x0;
    local_708 = 0;
    uStack_704 = 0;
    uStack_700 = 0;
    uStack_6fc = 0;
    _local_6f8 = 0;
    uStack_6f3 = 0;
    local_6f0 = 0;
    local_6ec = false;
    boost::multiprecision::default_ops::
    eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              ((cpp_dec_float<50U,_int,_void> *)&old_verbosity_2,&pnVar1->m_backend,
               (cpp_dec_float<50U,_int,_void> *)local_588);
    tVar2 = boost::multiprecision::operator<=
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&old_verbosity_1,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&old_verbosity_2);
    if (!tVar2) {
      result_1.m_backend.fpclass = cpp_dec_float_finite;
      result_1.m_backend.prec_elem = 10;
      result_1.m_backend.data._M_elems[0] = 0;
      result_1.m_backend.data._M_elems[1] = 0;
      result_1.m_backend.data._M_elems[2] = 0;
      result_1.m_backend.data._M_elems[3] = 0;
      result_1.m_backend.data._M_elems[4] = 0;
      result_1.m_backend.data._M_elems[5] = 0;
      result_1.m_backend.data._M_elems._24_5_ = 0;
      result_1.m_backend.data._M_elems[7]._1_3_ = 0;
      result_1.m_backend.data._M_elems._32_5_ = 0;
      result_1.m_backend._37_8_ = 0;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&result_1.m_backend,&pnVar1->m_backend,(cpp_dec_float<50U,_int,_void> *)&local_668)
      ;
      tVar2 = boost::multiprecision::operator<=
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)local_758,&result_1);
      if (!tVar2) goto LAB_00256c1a;
      vecExp_00 = (this->
                  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).m_activeColscaleExp;
      vecExp = (this->
               super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).m_activeRowscaleExp;
      if ((this->postequilibration & 1U) != 0) goto LAB_00256c7c;
      goto LAB_00256ced;
    }
    vecExp_00 = (this->
                super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).m_activeColscaleExp;
    vecExp = (this->
             super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).m_activeRowscaleExp;
    if (this->postequilibration == false) goto LAB_00256ced;
LAB_00256c7c:
    local_158.m_backend.data._M_elems[8] = epsilon.m_backend.data._M_elems[8];
    local_158.m_backend.data._M_elems[9] = epsilon.m_backend.data._M_elems[9];
    local_158.m_backend.data._M_elems[4] = epsilon.m_backend.data._M_elems[4];
    local_158.m_backend.data._M_elems[5] = epsilon.m_backend.data._M_elems[5];
    local_158.m_backend.data._M_elems[6] = epsilon.m_backend.data._M_elems[6];
    local_158.m_backend.data._M_elems[7] = epsilon.m_backend.data._M_elems[7];
    local_158.m_backend.data._M_elems[0] = epsilon.m_backend.data._M_elems[0];
    local_158.m_backend.data._M_elems[1] = epsilon.m_backend.data._M_elems[1];
    local_158.m_backend.data._M_elems[2] = epsilon.m_backend.data._M_elems[2];
    local_158.m_backend.data._M_elems[3] = epsilon.m_backend.data._M_elems[3];
    local_158.m_backend.exp = epsilon.m_backend.exp;
    local_158.m_backend.neg = epsilon.m_backend.neg;
    local_158.m_backend.fpclass = epsilon.m_backend.fpclass;
    local_158.m_backend.prec_elem = epsilon.m_backend.prec_elem;
    SPxEquiliSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::computePostequiExpVecs(lp,&rowscale,&colscale,vecExp,vecExp_00,&local_158);
  }
  else {
LAB_00256c1a:
    bVar10 = this->postequilibration == false;
    if (bVar10) {
      pSVar5 = (this->
               super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).spxout;
      if ((pSVar5 != (SPxOut *)0x0) && (3 < (int)pSVar5->m_verbosity)) {
        _old_verbosity_5 = (element_type *)CONCAT44(uStack_624,pSVar5->m_verbosity);
        local_5d8 = (double)CONCAT44(local_5d8._4_4_,4);
        (*pSVar5->_vptr_SPxOut[2])();
        pSVar5 = soplex::operator<<((this->
                                    super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ).spxout,"No geometric scaling done.");
        std::endl<char,std::char_traits<char>>(pSVar5->m_streams[pSVar5->m_verbosity]);
        pSVar5 = (this->
                 super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).spxout;
        (*pSVar5->_vptr_SPxOut[2])(pSVar5,&old_verbosity_5);
      }
      lp->_isScaled = true;
      goto LAB_0025700d;
    }
    vecExp_00 = (this->
                super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).m_activeColscaleExp;
    vecExp = (this->
             super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).m_activeRowscaleExp;
    if (!bVar10) {
      _old_verbosity_5 = (element_type *)0x3ff0000000000000;
      std::
      __fill_a1<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>*,double>
                (rowscale.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 rowscale.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(double *)&old_verbosity_5);
      _old_verbosity_5 = (element_type *)&DAT_3ff0000000000000;
      std::
      __fill_a1<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>*,double>
                (colscale.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 colscale.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(double *)&old_verbosity_5);
      goto LAB_00256c7c;
    }
LAB_00256ced:
    SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::computeExpVec(&this->
                     super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ,&colscale,vecExp_00);
    SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::computeExpVec(&this->
                     super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ,&rowscale,vecExp);
  }
  (*(this->
    super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    )._vptr_SPxScaler[2])(this,lp);
  pSVar5 = (this->
           super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).spxout;
  if (pSVar5 != (SPxOut *)0x0) {
    if (4 < (int)pSVar5->m_verbosity) {
      _old_verbosity_5 = (element_type *)CONCAT44(uStack_624,pSVar5->m_verbosity);
      local_5d8 = (double)CONCAT44(local_5d8._4_4_,5);
      (*pSVar5->_vptr_SPxOut[2])();
      pSVar5 = soplex::operator<<((this->
                                  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ).spxout,"Row scaling min= ");
      (*(this->
        super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        )._vptr_SPxScaler[0x31])(&local_190,this);
      pSVar5 = soplex::operator<<(pSVar5,&local_190);
      pSVar5 = soplex::operator<<(pSVar5," max= ");
      (*(this->
        super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        )._vptr_SPxScaler[0x32])(&local_1c8,this);
      pSVar5 = soplex::operator<<(pSVar5,&local_1c8);
      std::endl<char,std::char_traits<char>>(pSVar5->m_streams[pSVar5->m_verbosity]);
      pSVar5 = soplex::operator<<(pSVar5,"IGEOSC06 Col scaling min= ");
      (*(this->
        super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        )._vptr_SPxScaler[0x2f])(&local_200,this);
      pSVar5 = soplex::operator<<(pSVar5,&local_200);
      pSVar5 = soplex::operator<<(pSVar5," max= ");
      (*(this->
        super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        )._vptr_SPxScaler[0x30])(&local_238,this);
      pSVar5 = soplex::operator<<(pSVar5,&local_238);
      std::endl<char,std::char_traits<char>>(pSVar5->m_streams[pSVar5->m_verbosity]);
      pSVar5 = (this->
               super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).spxout;
      (*pSVar5->_vptr_SPxOut[2])(pSVar5,&old_verbosity_5);
      pSVar5 = (this->
               super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).spxout;
      if (pSVar5 == (SPxOut *)0x0) goto LAB_0025700d;
    }
    if (3 < (int)pSVar5->m_verbosity) {
      _old_verbosity_5 = (element_type *)CONCAT44(uStack_624,pSVar5->m_verbosity);
      local_5d8 = (double)CONCAT44(local_5d8._4_4_,4);
      (*pSVar5->_vptr_SPxOut[2])();
      pSVar5 = soplex::operator<<((this->
                                  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ).spxout,"after scaling: ");
      pSVar5 = soplex::operator<<(pSVar5," min= ");
      (*(lp->
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[3])(&local_270,lp,0);
      pSVar5 = soplex::operator<<(pSVar5,&local_270);
      pSVar5 = soplex::operator<<(pSVar5," max= ");
      (*(lp->
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[4])(&local_2a8,lp,0);
      pSVar5 = soplex::operator<<(pSVar5,&local_2a8);
      pSVar5 = soplex::operator<<(pSVar5," col-ratio= ");
      (*(this->
        super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        )._vptr_SPxScaler[0x33])(&local_2e0,this,lp);
      pSVar5 = soplex::operator<<(pSVar5,&local_2e0);
      pSVar5 = soplex::operator<<(pSVar5," row-ratio= ");
      (*(this->
        super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        )._vptr_SPxScaler[0x34])(&local_318,this,lp);
      pSVar5 = soplex::operator<<(pSVar5,&local_318);
      std::endl<char,std::char_traits<char>>(pSVar5->m_streams[pSVar5->m_verbosity]);
      pSVar5 = (this->
               super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).spxout;
      (*pSVar5->_vptr_SPxOut[2])(pSVar5,&old_verbosity_5);
    }
  }
LAB_0025700d:
  std::
  _Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::~_Vector_base(&colscale.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 );
  std::
  _Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::~_Vector_base(&rowscale.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 );
  return;
}

Assistant:

void SPxGeometSC<R>::scale(SPxLPBase<R>& lp, bool persistent)
{

   SPX_MSG_INFO1((*this->spxout), (*this->spxout) << "Geometric scaling LP" <<
                 (persistent ? " (persistent)" : "") << (postequilibration ? " with post-equilibration" : "") <<
                 std::endl;)

   this->setup(lp);

   /* We want to do that direction first, with the lower ratio.
    * See SPxEquiliSC<R>::scale() for a reasoning.
    */
   const R colratio = this->maxColRatio(lp);
   const R rowratio = this->maxRowRatio(lp);
   R epsilon = this->tolerances()->epsilon();

   const bool colFirst = colratio < rowratio;

   R p0start;
   R p1start;

   if(colFirst)
   {
      p0start = colratio;
      p1start = rowratio;
   }
   else
   {
      p0start = rowratio;
      p1start = colratio;
   }

   SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "before scaling:"
                 << " min= " << lp.minAbsNzo()
                 << " max= " << lp.maxAbsNzo()
                 << " col-ratio= " << colratio
                 << " row-ratio= " << rowratio
                 << std::endl;)

   // perform geometric scaling only if maximum ratio is above threshold
   bool geoscale = p1start > m_goodEnoughRatio;

   if(!geoscale)
   {
      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "No geometric scaling done, ratio good enough" <<
                    std::endl;)

      if(!postequilibration)
      {
         lp.setScalingInfo(true);
         return;
      }

      SPX_MSG_INFO2((*this->spxout),
                    (*this->spxout) << " ... but will still perform equilibrium scaling" <<
                    std::endl;)
   }

   std::vector<R> rowscale(unsigned(lp.nRows()), 1.0);
   std::vector<R> colscale(unsigned(lp.nCols()), 1.0);

   R p0 = 0.0;
   R p1 = 0.0;

   if(geoscale)
   {
      R p0prev = p0start;
      R p1prev = p1start;

      // we make at most maxIterations.
      for(int count = 0; count < m_maxIterations; count++)
      {
         if(colFirst)
         {
            p0 = computeScalingVec(lp.colSet(), rowscale, colscale, epsilon);
            p1 = computeScalingVec(lp.rowSet(), colscale, rowscale, epsilon);
         }
         else
         {
            p0 = computeScalingVec(lp.rowSet(), colscale, rowscale, epsilon);
            p1 = computeScalingVec(lp.colSet(), rowscale, colscale, epsilon);
         }

         SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "Geometric scaling round " << count
                       << " col-ratio= " << (colFirst ? p0 : p1)
                       << " row-ratio= " << (colFirst ? p1 : p0)
                       << std::endl;)

         if(p0 > m_minImprovement * p0prev && p1 > m_minImprovement * p1prev)
            break;

         p0prev = p0;
         p1prev = p1;
      }

      // perform geometric scaling only if there is enough (default 15%) improvement.
      geoscale = (p0 <= m_minImprovement * p0start || p1 <= m_minImprovement * p1start);
   }

   if(!geoscale && !postequilibration)
   {
      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "No geometric scaling done." << std::endl;)
      lp.setScalingInfo(true);
   }
   else
   {
      DataArray<int>& colscaleExp = *this->m_activeColscaleExp;
      DataArray<int>& rowscaleExp = *this->m_activeRowscaleExp;

      if(postequilibration)
      {
         if(!geoscale)
         {
            std::fill(rowscale.begin(), rowscale.end(), 1.0);
            std::fill(colscale.begin(), colscale.end(), 1.0);
         }

         SPxEquiliSC<R>::computePostequiExpVecs(lp, rowscale, colscale, rowscaleExp, colscaleExp, epsilon);
      }
      else
      {
         this->computeExpVec(colscale, colscaleExp);
         this->computeExpVec(rowscale, rowscaleExp);
      }

      this->applyScaling(lp);

      SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "Row scaling min= " << this->minAbsRowscale()
                    << " max= " << this->maxAbsRowscale()
                    << std::endl
                    << "IGEOSC06 Col scaling min= " << this->minAbsColscale()
                    << " max= " << this->maxAbsColscale()
                    << std::endl;)

      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "after scaling: "
                    << " min= " << lp.minAbsNzo(false)
                    << " max= " << lp.maxAbsNzo(false)
                    << " col-ratio= " << this->maxColRatio(lp)
                    << " row-ratio= " << this->maxRowRatio(lp)
                    << std::endl;)
   }
}